

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int iVar1;
  char *pcVar2;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    if (key == 0x20) {
      swap_interval = 1 - swap_interval;
      printf("(( swap interval: %i ))\n",(ulong)(uint)swap_interval);
      glfwSwapInterval(swap_interval);
    }
    else if (key == 0x30) {
      glfwSetCursor(window,(GLFWcursor *)0x0);
    }
    else if (key == 0x31) {
      glfwSetCursor(window,standard_cursors[0]);
    }
    else if (key == 0x32) {
      glfwSetCursor(window,standard_cursors[1]);
    }
    else if (key == 0x33) {
      glfwSetCursor(window,standard_cursors[2]);
    }
    else if (key == 0x34) {
      glfwSetCursor(window,standard_cursors[3]);
    }
    else if (key == 0x35) {
      glfwSetCursor(window,standard_cursors[4]);
    }
    else if (key == 0x36) {
      glfwSetCursor(window,standard_cursors[5]);
    }
    else if (key == 0x41) {
      animate_cursor = (int)((animate_cursor != 0 ^ 0xffU) & 1);
      if (animate_cursor == 0) {
        glfwSetCursor(window,(GLFWcursor *)0x0);
      }
    }
    else if (key == 0x44) {
      glfwSetInputMode(window,0x33001,0x34003);
      printf("(( cursor is disabled ))\n");
    }
    else if (key == 0x48) {
      glfwSetInputMode(window,0x33001,0x34002);
      printf("(( cursor is hidden ))\n");
    }
    else {
      if (key != 0x4e) {
        if (key == 0x54) {
          track_cursor = (uint)((track_cursor != 0 ^ 0xffU) & 1);
          return;
        }
        if (key == 0x57) {
          wait_events = (int)((wait_events != 0 ^ 0xffU) & 1);
          pcVar2 = "poll";
          if (wait_events != 0) {
            pcVar2 = "wait";
          }
          printf("(( %sing for events ))\n",pcVar2);
          return;
        }
        if (key != 0x100) {
          return;
        }
        iVar1 = glfwGetInputMode(window,0x33001);
        if (iVar1 != 0x34003) {
          glfwSetWindowShouldClose(window,1);
          return;
        }
      }
      glfwSetInputMode(window,0x33001,0x34001);
      printf("(( cursor is normal ))\n");
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_A:
        {
            animate_cursor = !animate_cursor;
            if (!animate_cursor)
                glfwSetCursor(window, NULL);

            break;
        }

        case GLFW_KEY_ESCAPE:
        {
            if (glfwGetInputMode(window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
            {
                glfwSetWindowShouldClose(window, GLFW_TRUE);
                break;
            }

            /* FALLTHROUGH */
        }

        case GLFW_KEY_N:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            printf("(( cursor is normal ))\n");
            break;

        case GLFW_KEY_D:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            printf("(( cursor is disabled ))\n");
            break;

        case GLFW_KEY_H:
            glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            printf("(( cursor is hidden ))\n");
            break;

        case GLFW_KEY_SPACE:
            swap_interval = 1 - swap_interval;
            printf("(( swap interval: %i ))\n", swap_interval);
            glfwSwapInterval(swap_interval);
            break;

        case GLFW_KEY_W:
            wait_events = !wait_events;
            printf("(( %sing for events ))\n", wait_events ? "wait" : "poll");
            break;

        case GLFW_KEY_T:
            track_cursor = !track_cursor;
            break;

        case GLFW_KEY_0:
            glfwSetCursor(window, NULL);
            break;

        case GLFW_KEY_1:
            glfwSetCursor(window, standard_cursors[0]);
            break;

        case GLFW_KEY_2:
            glfwSetCursor(window, standard_cursors[1]);
            break;

        case GLFW_KEY_3:
            glfwSetCursor(window, standard_cursors[2]);
            break;

        case GLFW_KEY_4:
            glfwSetCursor(window, standard_cursors[3]);
            break;

        case GLFW_KEY_5:
            glfwSetCursor(window, standard_cursors[4]);
            break;

        case GLFW_KEY_6:
            glfwSetCursor(window, standard_cursors[5]);
            break;
    }
}